

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.hpp
# Opt level: O0

double __thiscall
strq::Generator<double,void>::operator()
          (Generator<double,void> *this,Arithmetic<std::normal_distribution<double>_> schema)

{
  result_type_conflict2 rVar1;
  result_type rVar2;
  normal_distribution<double> local_2750;
  random_device local_2720;
  undefined1 local_1398 [8];
  mt19937 gen;
  Generator<double,_void> *this_local;
  
  gen._M_p = (size_t)this;
  std::random_device::random_device(&local_2720);
  rVar1 = std::random_device::operator()(&local_2720);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_1398,(ulong)rVar1);
  std::random_device::~random_device(&local_2720);
  Arithmetic<std::normal_distribution<double>_>::distribution(&local_2750,&schema);
  rVar2 = std::normal_distribution<double>::operator()
                    (&local_2750,
                     (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)local_1398);
  return rVar2;
}

Assistant:

auto operator()(Arithmetic<Dist> schema) -> T
        {
            std::mt19937 gen{std::random_device{}()};

            if constexpr (std::is_same_v<Dist, detail::NoDistribution>) {
                return std::uniform_real_distribution<T>{}(gen);
            }
            else {
                return schema.distribution()(gen);
            }
        }